

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fUniformApiTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::UniformCase::UniformCase
          (UniformCase *this,Context *context,char *name,char *description,
          CaseShaderType caseShaderType,
          SharedPtr<const_deqp::gles3::Functional::(anonymous_namespace)::UniformCollection>
          *uniformCollection,deUint32 features)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestLog *log;
  SharedPtr<const_deqp::gles3::Functional::(anonymous_namespace)::UniformCollection>
  *uniformCollection_local;
  CaseShaderType caseShaderType_local;
  char *description_local;
  char *name_local;
  Context *context_local;
  UniformCase *this_local;
  
  gles3::TestCase::TestCase(&this->super_TestCase,context,name,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__UniformCase_032a8d40;
  pRVar2 = gles3::Context::getRenderContext(context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  log = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::CallLogWrapper::CallLogWrapper
            (&this->super_CallLogWrapper,(Functions *)CONCAT44(extraout_var,iVar1),log);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__UniformCase_032a8d40;
  *(deUint32 *)&(this->super_CallLogWrapper).field_0x14 = features;
  de::SharedPtr<const_deqp::gles3::Functional::(anonymous_namespace)::UniformCollection>::SharedPtr
            (&this->m_uniformCollection,uniformCollection);
  this->m_caseShaderType = caseShaderType;
  std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::vector(&this->m_textures2d);
  std::vector<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>::vector
            (&this->m_texturesCube);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->m_filledTextureUnits);
  return;
}

Assistant:

UniformCase::UniformCase (Context& context, const char* const name, const char* const description, const CaseShaderType caseShaderType, const SharedPtr<const UniformCollection>& uniformCollection, const deUint32 features)
	: TestCase				(context, name, description)
	, CallLogWrapper		(context.getRenderContext().getFunctions(), m_testCtx.getLog())
	, m_features			(features)
	, m_uniformCollection	(uniformCollection)
	, m_caseShaderType		(caseShaderType)
{
}